

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O0

void VP8CalculateLevelCosts(VP8EncProba *proba)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  short *psVar7;
  long in_RDI;
  int v;
  int cost_base;
  int cost0;
  uint16_t *table;
  uint8_t *p;
  int n;
  int ctx;
  int band;
  int ctype;
  int level;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  if (*(int *)(in_RDI + 0x4da8) != 0) {
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
        for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
          puVar6 = (uint8_t *)
                   (in_RDI + 4 + (long)local_c * 0x108 + (long)local_10 * 0x21 +
                   (long)local_14 * 0xb);
          psVar7 = (short *)(in_RDI + 0x14a4 + (long)local_c * 0xcc0 + (long)local_10 * 0x198 +
                            (long)local_14 * 0x88);
          if (local_14 < 1) {
            iVar2 = 0;
          }
          else {
            iVar2 = VP8BitCost(1,*puVar6);
          }
          level = iVar2;
          iVar3 = VP8BitCost(1,puVar6[1]);
          sVar1 = (short)level;
          iVar4 = VP8BitCost(0,puVar6[1]);
          *psVar7 = (short)iVar4 + (short)level;
          for (iVar4 = 1; iVar4 < 0x44; iVar4 = iVar4 + 1) {
            iVar5 = VariableLevelCost(level,(uint8_t *)CONCAT44(iVar4,iVar2));
            psVar7[iVar4] = (short)iVar3 + sVar1 + (short)iVar5;
          }
        }
      }
      for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
        for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
          *(ulong *)(in_RDI + 0x47a8 + (long)local_c * 0x180 + (long)local_18 * 0x18 +
                    (long)local_14 * 8) =
               in_RDI + 0x14a4 + (long)local_c * 0xcc0 + (ulong)""[local_18] * 0x198 +
               (long)local_14 * 0x88;
        }
      }
    }
    *(undefined4 *)(in_RDI + 0x4da8) = 0;
  }
  return;
}

Assistant:

void VP8CalculateLevelCosts(VP8EncProba* const proba) {
  int ctype, band, ctx;

  if (!proba->dirty) return;  // nothing to do.

  for (ctype = 0; ctype < NUM_TYPES; ++ctype) {
    int n;
    for (band = 0; band < NUM_BANDS; ++band) {
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        const uint8_t* const p = proba->coeffs[ctype][band][ctx];
        uint16_t* const table = proba->level_cost[ctype][band][ctx];
        const int cost0 = (ctx > 0) ? VP8BitCost(1, p[0]) : 0;
        const int cost_base = VP8BitCost(1, p[1]) + cost0;
        int v;
        table[0] = VP8BitCost(0, p[1]) + cost0;
        for (v = 1; v <= MAX_VARIABLE_LEVEL; ++v) {
          table[v] = cost_base + VariableLevelCost(v, p);
        }
        // Starting at level 67 and up, the variable part of the cost is
        // actually constant.
      }
    }
    for (n = 0; n < 16; ++n) {    // replicate bands. We don't need to sentinel.
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        proba->remapped_costs[ctype][n][ctx] =
            proba->level_cost[ctype][VP8EncBands[n]][ctx];
      }
    }
  }
  proba->dirty = 0;
}